

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

bool __thiscall AggressiveBotStrategy::canFortify(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  bool bVar3;
  Country *pCVar4;
  pointer ppCVar5;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar5 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar4 = (Country *)0x0;
  do {
    if ((pCVar4 == (Country *)0x0) || (*pCVar4->pNumberOfTroops < *(*ppCVar5)->pNumberOfTroops)) {
      pCVar4 = *ppCVar5;
    }
    ppCVar5 = ppCVar5 + 1;
  } while (ppCVar5 !=
           (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
           super__Vector_impl_data._M_finish);
  ppCVar5 = (pCVar4->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pCVar4->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar5 == ppCVar2) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      if (*(*ppCVar5)->pPlayerOwnerId == *pCVar4->pPlayerOwnerId) {
        bVar3 = (bool)(bVar3 | 1 < *(*ppCVar5)->pNumberOfTroops);
      }
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 != ppCVar2);
  }
  return bVar3;
}

Assistant:

bool AggressiveBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* biggestCountry = nullptr;
    for (auto* country: *player->getOwnedCountries()) {
        if (biggestCountry == nullptr || biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            biggestCountry = country;
        }
    }
    for (auto* neighbour : *biggestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == biggestCountry->getPlayerOwnerID() && neighbour->getNumberOfTroops() > 1) {
            canFortify = true;
        }
    }
    return canFortify;
}